

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall testing::Matcher<unsigned_int>::Matcher(Matcher<unsigned_int> *this,uint value)

{
  linked_ptr<const_testing::MatcherInterface<unsigned_int>_> local_38;
  
  (this->super_MatcherBase<unsigned_int>).impl_.value_ = (MatcherInterface<unsigned_int> *)0x0;
  (this->super_MatcherBase<unsigned_int>).impl_.link_.next_ =
       &(this->super_MatcherBase<unsigned_int>).impl_.link_;
  (this->super_MatcherBase<unsigned_int>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001d7538;
  local_38.value_ = (MatcherInterface<unsigned_int> *)operator_new(0x10);
  ((local_38.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001d7728;
  *(uint *)&local_38.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       value;
  local_38.link_.next_ = &local_38.link_;
  internal::linked_ptr<const_testing::MatcherInterface<unsigned_int>_>::operator=
            (&(this->super_MatcherBase<unsigned_int>).impl_,&local_38);
  internal::linked_ptr<const_testing::MatcherInterface<unsigned_int>_>::~linked_ptr(&local_38);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }